

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_portable.c
# Opt level: O0

void blake3_compress_xof_portable
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags,
               uint8_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint8_t *p_31;
  uint8_t *p_30;
  uint8_t *p_29;
  uint8_t *p_28;
  uint8_t *p_27;
  uint8_t *p_26;
  uint8_t *p_25;
  uint8_t *p_24;
  uint8_t *p_23;
  uint8_t *p_22;
  uint8_t *p_21;
  uint8_t *p_20;
  uint8_t *p_19;
  uint8_t *p_18;
  uint8_t *p_17;
  uint8_t *p_16;
  uint8_t *p_15;
  uint8_t *p_14;
  uint8_t *p_13;
  uint8_t *p_12;
  uint8_t *p_11;
  uint8_t *p_10;
  uint8_t *p_9;
  uint8_t *p_8;
  uint8_t *p_7;
  uint8_t *p_6;
  uint8_t *p_5;
  uint8_t *p_4;
  uint8_t *p_3;
  uint8_t *p_2;
  uint8_t *p_1;
  uint8_t *p;
  uint8_t *schedule_6;
  uint8_t *schedule_5;
  uint8_t *schedule_4;
  uint8_t *schedule_3;
  uint8_t *schedule_2;
  uint8_t *schedule_1;
  uint8_t *schedule;
  uint local_15a8;
  uint local_15a4;
  uint32_t state [16];
  uint8_t *out_local;
  uint8_t flags_local;
  uint64_t counter_local;
  uint8_t block_len_local;
  uint8_t *block_local;
  uint32_t *cv_local;
  
  uVar4 = cv[1];
  uVar5 = cv[2];
  uVar6 = cv[3];
  uVar7 = cv[4];
  uVar8 = cv[5];
  uVar1 = cv[6];
  uVar2 = cv[7];
  local_15a4 = (uint)(counter >> 0x20);
  local_15a8 = (uint)counter;
  uVar3 = *cv ^ 0x6a09e667;
  *out = (uint8_t)uVar3;
  out[1] = (uint8_t)(uVar3 >> 8);
  out[2] = (uint8_t)(uVar3 >> 0x10);
  out[3] = (uint8_t)(uVar3 >> 0x18);
  uVar4 = uVar4 ^ 0xbb67ae85;
  out[4] = (uint8_t)uVar4;
  out[5] = (uint8_t)(uVar4 >> 8);
  out[6] = (uint8_t)(uVar4 >> 0x10);
  out[7] = (uint8_t)(uVar4 >> 0x18);
  uVar5 = uVar5 ^ 0x3c6ef372;
  out[8] = (uint8_t)uVar5;
  out[9] = (uint8_t)(uVar5 >> 8);
  out[10] = (uint8_t)(uVar5 >> 0x10);
  out[0xb] = (uint8_t)(uVar5 >> 0x18);
  uVar6 = uVar6 ^ 0xa54ff53a;
  out[0xc] = (uint8_t)uVar6;
  out[0xd] = (uint8_t)(uVar6 >> 8);
  out[0xe] = (uint8_t)(uVar6 >> 0x10);
  out[0xf] = (uint8_t)(uVar6 >> 0x18);
  uVar7 = uVar7 ^ local_15a8;
  out[0x10] = (uint8_t)uVar7;
  out[0x11] = (uint8_t)(uVar7 >> 8);
  out[0x12] = (uint8_t)(uVar7 >> 0x10);
  out[0x13] = (uint8_t)(uVar7 >> 0x18);
  uVar8 = uVar8 ^ local_15a4;
  out[0x14] = (uint8_t)uVar8;
  out[0x15] = (uint8_t)(uVar8 >> 8);
  out[0x16] = (uint8_t)(uVar8 >> 0x10);
  out[0x17] = (uint8_t)(uVar8 >> 0x18);
  out[0x18] = (byte)uVar1 ^ block_len;
  out[0x19] = (uint8_t)(uVar1 >> 8);
  out[0x1a] = (uint8_t)(uVar1 >> 0x10);
  out[0x1b] = (uint8_t)(uVar1 >> 0x18);
  out[0x1c] = (byte)uVar2 ^ flags;
  out[0x1d] = (uint8_t)(uVar2 >> 8);
  out[0x1e] = (uint8_t)(uVar2 >> 0x10);
  out[0x1f] = (uint8_t)(uVar2 >> 0x18);
  uVar4 = *cv ^ 0x6a09e667;
  out[0x20] = (uint8_t)uVar4;
  out[0x21] = (uint8_t)(uVar4 >> 8);
  out[0x22] = (uint8_t)(uVar4 >> 0x10);
  out[0x23] = (uint8_t)(uVar4 >> 0x18);
  uVar4 = cv[1] ^ 0xbb67ae85;
  out[0x24] = (uint8_t)uVar4;
  out[0x25] = (uint8_t)(uVar4 >> 8);
  out[0x26] = (uint8_t)(uVar4 >> 0x10);
  out[0x27] = (uint8_t)(uVar4 >> 0x18);
  uVar4 = cv[2] ^ 0x3c6ef372;
  out[0x28] = (uint8_t)uVar4;
  out[0x29] = (uint8_t)(uVar4 >> 8);
  out[0x2a] = (uint8_t)(uVar4 >> 0x10);
  out[0x2b] = (uint8_t)(uVar4 >> 0x18);
  uVar4 = cv[3] ^ 0xa54ff53a;
  out[0x2c] = (uint8_t)uVar4;
  out[0x2d] = (uint8_t)(uVar4 >> 8);
  out[0x2e] = (uint8_t)(uVar4 >> 0x10);
  out[0x2f] = (uint8_t)(uVar4 >> 0x18);
  local_15a8 = local_15a8 ^ cv[4];
  out[0x30] = (uint8_t)local_15a8;
  out[0x31] = (uint8_t)(local_15a8 >> 8);
  out[0x32] = (uint8_t)(local_15a8 >> 0x10);
  out[0x33] = (uint8_t)(local_15a8 >> 0x18);
  local_15a4 = local_15a4 ^ cv[5];
  out[0x34] = (uint8_t)local_15a4;
  out[0x35] = (uint8_t)(local_15a4 >> 8);
  out[0x36] = (uint8_t)(local_15a4 >> 0x10);
  out[0x37] = (uint8_t)(local_15a4 >> 0x18);
  uVar1 = cv[6];
  out[0x38] = block_len ^ (byte)uVar1;
  out[0x39] = (uint8_t)(uVar1 >> 8);
  out[0x3a] = (uint8_t)(uVar1 >> 0x10);
  out[0x3b] = (uint8_t)(uVar1 >> 0x18);
  uVar1 = cv[7];
  out[0x3c] = flags ^ (byte)uVar1;
  out[0x3d] = (uint8_t)(uVar1 >> 8);
  out[0x3e] = (uint8_t)(uVar1 >> 0x10);
  out[0x3f] = (uint8_t)(uVar1 >> 0x18);
  return;
}

Assistant:

void blake3_compress_xof_portable(const uint32_t cv[8],
                                  const uint8_t block[BLAKE3_BLOCK_LEN],
                                  uint8_t block_len, uint64_t counter,
                                  uint8_t flags, uint8_t out[64]) {
  uint32_t state[16];
  compress_pre(state, cv, block, block_len, counter, flags);

  store32(&out[0 * 4], state[0] ^ state[8]);
  store32(&out[1 * 4], state[1] ^ state[9]);
  store32(&out[2 * 4], state[2] ^ state[10]);
  store32(&out[3 * 4], state[3] ^ state[11]);
  store32(&out[4 * 4], state[4] ^ state[12]);
  store32(&out[5 * 4], state[5] ^ state[13]);
  store32(&out[6 * 4], state[6] ^ state[14]);
  store32(&out[7 * 4], state[7] ^ state[15]);
  store32(&out[8 * 4], state[8] ^ cv[0]);
  store32(&out[9 * 4], state[9] ^ cv[1]);
  store32(&out[10 * 4], state[10] ^ cv[2]);
  store32(&out[11 * 4], state[11] ^ cv[3]);
  store32(&out[12 * 4], state[12] ^ cv[4]);
  store32(&out[13 * 4], state[13] ^ cv[5]);
  store32(&out[14 * 4], state[14] ^ cv[6]);
  store32(&out[15 * 4], state[15] ^ cv[7]);
}